

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

void __thiscall
ON_ComponentManifestTableIndex::RemoveAllItems
          (ON_ComponentManifestTableIndex *this,bool bResetManifestIndex)

{
  undefined3 in_register_00000031;
  
  ON_SimpleArray<const_ON_ComponentManifestItem_PRIVATE_*>::Zero(&this->m_item_list);
  if ((CONCAT31(in_register_00000031,bResetManifestIndex) != 0) &&
     (-1 < (this->m_item_list).m_capacity)) {
    (this->m_item_list).m_count = 0;
  }
  this->m_deleted_item_count = 0;
  this->m_system_item_count = 0;
  this->m_active_and_deleted_item_count = 0;
  this->m_first_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  this->m_last_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  this->m_first_system_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  this->m_last_system_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  return;
}

Assistant:

void ON_ComponentManifestTableIndex::RemoveAllItems(
  bool bResetManifestIndex
  )
{
  m_item_list.Zero();
  if ( bResetManifestIndex )
    m_item_list.SetCount(0);
  
  m_active_and_deleted_item_count = 0;
  m_deleted_item_count = 0;

  m_first_item = nullptr;
  m_last_item = nullptr;

  m_system_item_count = 0;
  m_first_system_item = nullptr;
  m_last_system_item = nullptr;
}